

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_kernel_2.h
# Opt level: O2

void __thiscall
dlib::
memory_manager_kernel_2<dlib::stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>::node,_10UL>
::deallocate(memory_manager_kernel_2<dlib::stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>::node,_10UL>
             *this,node *item)

{
  this->allocations = this->allocations - 1;
  std::__cxx11::string::~string((string *)&item->item);
  item->next = (node *)this->next;
  this->next = (node *)item;
  return;
}

Assistant:

void deallocate (
            T* item
        ) 
        { 
            --allocations;  
            item->~T();

            // add this memory into our linked list.
            node* temp = reinterpret_cast<node*>(item);
            temp->next = next;
            next = temp;                
        }